

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O3

void png_handle_iCCP(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  byte *pbVar1;
  ushort uVar2;
  png_uint_32 skip;
  png_colorspacerp colorspace;
  int iVar3;
  ulong uVar4;
  png_bytep __dest;
  png_charp __dest_00;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  png_alloc_size_t size;
  char keyword [81];
  Byte profile_header [132];
  Byte local_buffer [1024];
  int in_stack_fffffffffffffa98;
  png_uint_32 local_55c;
  png_bytep local_558;
  ulong local_550;
  png_colorspacerp local_548;
  png_alloc_size_t local_540;
  ulong local_538;
  ulong local_530;
  png_byte local_528 [96];
  uint local_4c8 [32];
  byte local_448;
  byte local_447;
  byte local_446;
  byte local_445;
  png_byte local_438 [1032];
  
  local_55c = length;
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 6) != 0) {
    png_crc_finish(png_ptr,length);
    pcVar6 = "out of place";
LAB_0011cc26:
    png_chunk_benign_error(png_ptr,pcVar6);
    return;
  }
  if (length < 0xe) {
    png_crc_finish(png_ptr,length);
    pcVar6 = "too short";
    goto LAB_0011cc26;
  }
  uVar2 = (png_ptr->colorspace).flags;
  if ((short)uVar2 < 0) {
    png_crc_finish(png_ptr,length);
    return;
  }
  if ((uVar2 & 4) != 0) {
    pcVar6 = "too many profiles";
    goto LAB_0011ccb6;
  }
  uVar5 = 0x51;
  if (length < 0x51) {
    uVar5 = length;
  }
  png_crc_read(png_ptr,local_528,uVar5);
  local_55c = length - uVar5;
  if (local_55c < 0xb) {
    png_crc_finish(png_ptr,local_55c);
    pcVar6 = "too short";
    goto LAB_0011ccdf;
  }
  uVar7 = 0x50;
  if (length < 0x50) {
    uVar7 = (ulong)length;
  }
  uVar4 = 0;
  do {
    if (local_528[uVar4] == '\0') {
      uVar7 = uVar4 & 0xffffffff;
      break;
    }
    uVar4 = uVar4 + 1;
  } while (uVar7 != uVar4);
  if ((int)uVar7 - 1U < 0x4f) {
    pcVar6 = "bad compression method";
    if ((uVar5 <= (uint)(uVar7 + 1)) || (local_528[uVar7 + 1] != '\0')) goto LAB_0011ccb6;
    local_548 = &png_ptr->colorspace;
    local_540 = uVar7 + 1;
    iVar3 = png_inflate_claim(png_ptr,0x69434350);
    if (iVar3 != 0) {
      pcVar6 = (png_ptr->zstream).msg;
      goto LAB_0011ccb6;
    }
    memset(local_4c8,0,0x84);
    local_550 = 0x84;
    (png_ptr->zstream).next_in = local_528 + uVar7 + 2;
    (png_ptr->zstream).avail_in = (uVar5 - (int)uVar7) - 2;
    png_inflate_read(png_ptr,local_438,(uInt)&local_55c,local_4c8,(png_bytep)&local_550,
                     (png_alloc_size_t *)0x0,in_stack_fffffffffffffa98);
    colorspace = local_548;
    if (local_550 != 0) {
LAB_0011cde8:
      pcVar6 = (png_ptr->zstream).msg;
LAB_0011cf81:
      png_ptr->zowner = 0;
      goto LAB_0011ccb6;
    }
    uVar5 = local_4c8[0] >> 0x18 | (local_4c8[0] & 0xff0000) >> 8 | (local_4c8[0] & 0xff00) << 8 |
            local_4c8[0] << 0x18;
    iVar3 = png_icc_check_length(png_ptr,local_548,(png_const_charp)local_528,uVar5);
    if ((iVar3 == 0) ||
       (iVar3 = png_icc_check_header
                          (png_ptr,colorspace,(png_const_charp)local_528,uVar5,
                           (png_const_bytep)local_4c8,(uint)png_ptr->color_type), iVar3 == 0)) {
LAB_0011cf7e:
      pcVar6 = (char *)0x0;
      goto LAB_0011cf81;
    }
    local_558 = (png_bytep)(ulong)local_448;
    local_530 = (ulong)uVar5;
    __dest = png_read_buffer(png_ptr,local_530,2);
    if (__dest == (png_bytep)0x0) {
      pcVar6 = "out of memory";
      goto LAB_0011cf81;
    }
    iVar3 = (int)local_558;
    memcpy(__dest,local_4c8,0x84);
    local_550 = (ulong)(((uint)local_445 |
                        (uint)local_446 << 8 | (uint)local_447 << 0x10 | iVar3 << 0x18) * 0xc);
    local_558 = __dest;
    local_538 = local_550;
    png_inflate_read(png_ptr,local_438,(uInt)&local_55c,(png_uint_32p)(__dest + 0x84),
                     (png_bytep)&local_550,(png_alloc_size_t *)0x0,in_stack_fffffffffffffa98);
    if (local_550 != 0) goto LAB_0011cde8;
    iVar3 = png_icc_check_tag_table(png_ptr,local_548,(png_const_charp)local_528,uVar5,local_558);
    if (iVar3 == 0) goto LAB_0011cf7e;
    local_550 = (local_530 - local_538) - 0x84;
    png_inflate_read(png_ptr,local_438,(uInt)&local_55c,
                     (png_uint_32p)((long)(__dest + 0x84) + local_538),(png_bytep)&local_550,
                     (png_alloc_size_t *)0x1,in_stack_fffffffffffffa98);
    skip = local_55c;
    if (local_55c == 0) {
      if (local_550 != 0) goto LAB_0011cde8;
    }
    else {
      if ((png_ptr->flags & 0x100000) == 0) {
        pcVar6 = "extra compressed data";
        goto LAB_0011cf81;
      }
      if (local_550 != 0) goto LAB_0011cde8;
      png_chunk_warning(png_ptr,"extra compressed data");
    }
    png_crc_finish(png_ptr,skip);
    png_icc_set_sRGB(png_ptr,local_548,local_558,(png_ptr->zstream).adler);
    if (info_ptr == (png_inforp)0x0) {
LAB_0011d05e:
      png_ptr->zowner = 0;
      return;
    }
    png_free_data(png_ptr,info_ptr,0x10,0);
    __dest_00 = (png_charp)png_malloc_base(png_ptr,local_540);
    info_ptr->iccp_name = __dest_00;
    if (__dest_00 != (png_charp)0x0) {
      memcpy(__dest_00,local_528,local_540);
      info_ptr->iccp_proflen = uVar5;
      info_ptr->iccp_profile = local_558;
      *(byte *)&info_ptr->free_me = (byte)info_ptr->free_me | 0x10;
      png_ptr->read_buffer = (png_bytep)0x0;
      pbVar1 = (byte *)((long)&info_ptr->valid + 1);
      *pbVar1 = *pbVar1 | 0x10;
      png_colorspace_sync(png_ptr,info_ptr);
      goto LAB_0011d05e;
    }
    pbVar1 = (byte *)((long)&(png_ptr->colorspace).flags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    png_colorspace_sync(png_ptr,info_ptr);
    png_ptr->zowner = 0;
    pcVar6 = "out of memory";
  }
  else {
    pcVar6 = "bad keyword";
LAB_0011ccb6:
    png_crc_finish(png_ptr,local_55c);
  }
  pbVar1 = (byte *)((long)&(png_ptr->colorspace).flags + 1);
  *pbVar1 = *pbVar1 | 0x80;
  png_colorspace_sync(png_ptr,info_ptr);
  if (pcVar6 == (char *)0x0) {
    return;
  }
LAB_0011ccdf:
  png_chunk_benign_error(png_ptr,pcVar6);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_iCCP(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
/* Note: this does not properly handle profiles that are > 64K under DOS */
{
   png_const_charp errmsg = NULL; /* error message output, or no error */
   int finished = 0; /* crc checked */

   png_debug(1, "in png_handle_iCCP");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & (PNG_HAVE_IDAT|PNG_HAVE_PLTE)) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   /* Consistent with all the above colorspace handling an obviously *invalid*
    * chunk is just ignored, so does not invalidate the color space.  An
    * alternative is to set the 'invalid' flags at the start of this routine
    * and only clear them in they were not set before and all the tests pass.
    */

   /* The keyword must be at least one character and there is a
    * terminator (0) byte and the compression method byte, and the
    * 'zlib' datastream is at least 11 bytes.
    */
   if (length < 14)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "too short");
      return;
   }

   /* If a colorspace error has already been output skip this chunk */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_INVALID) != 0)
   {
      png_crc_finish(png_ptr, length);
      return;
   }

   /* Only one sRGB or iCCP chunk is allowed, use the HAVE_INTENT flag to detect
    * this.
    */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_INTENT) == 0)
   {
      uInt read_length, keyword_length;
      char keyword[81];

      /* Find the keyword; the keyword plus separator and compression method
       * bytes can be at most 81 characters long.
       */
      read_length = 81; /* maximum */
      if (read_length > length)
         read_length = (uInt)length;

      png_crc_read(png_ptr, (png_bytep)keyword, read_length);
      length -= read_length;

      /* The minimum 'zlib' stream is assumed to be just the 2 byte header,
       * 5 bytes minimum 'deflate' stream, and the 4 byte checksum.
       */
      if (length < 11)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "too short");
         return;
      }

      keyword_length = 0;
      while (keyword_length < 80 && keyword_length < read_length &&
         keyword[keyword_length] != 0)
         ++keyword_length;

      /* TODO: make the keyword checking common */
      if (keyword_length >= 1 && keyword_length <= 79)
      {
         /* We only understand '0' compression - deflate - so if we get a
          * different value we can't safely decode the chunk.
          */
         if (keyword_length+1 < read_length &&
            keyword[keyword_length+1] == PNG_COMPRESSION_TYPE_BASE)
         {
            read_length -= keyword_length+2;

            if (png_inflate_claim(png_ptr, png_iCCP) == Z_OK)
            {
               Byte profile_header[132]={0};
               Byte local_buffer[PNG_INFLATE_BUF_SIZE];
               png_alloc_size_t size = (sizeof profile_header);

               png_ptr->zstream.next_in = (Bytef*)keyword + (keyword_length+2);
               png_ptr->zstream.avail_in = read_length;
               (void)png_inflate_read(png_ptr, local_buffer,
                   (sizeof local_buffer), &length, profile_header, &size,
                   0/*finish: don't, because the output is too small*/);

               if (size == 0)
               {
                  /* We have the ICC profile header; do the basic header checks.
                   */
                  png_uint_32 profile_length = png_get_uint_32(profile_header);

                  if (png_icc_check_length(png_ptr, &png_ptr->colorspace,
                      keyword, profile_length) != 0)
                  {
                     /* The length is apparently ok, so we can check the 132
                      * byte header.
                      */
                     if (png_icc_check_header(png_ptr, &png_ptr->colorspace,
                         keyword, profile_length, profile_header,
                         png_ptr->color_type) != 0)
                     {
                        /* Now read the tag table; a variable size buffer is
                         * needed at this point, allocate one for the whole
                         * profile.  The header check has already validated
                         * that none of this stuff will overflow.
                         */
                        png_uint_32 tag_count =
                           png_get_uint_32(profile_header + 128);
                        png_bytep profile = png_read_buffer(png_ptr,
                            profile_length, 2/*silent*/);

                        if (profile != NULL)
                        {
                           memcpy(profile, profile_header,
                               (sizeof profile_header));

                           size = 12 * tag_count;

                           (void)png_inflate_read(png_ptr, local_buffer,
                               (sizeof local_buffer), &length,
                               profile + (sizeof profile_header), &size, 0);

                           /* Still expect a buffer error because we expect
                            * there to be some tag data!
                            */
                           if (size == 0)
                           {
                              if (png_icc_check_tag_table(png_ptr,
                                  &png_ptr->colorspace, keyword, profile_length,
                                  profile) != 0)
                              {
                                 /* The profile has been validated for basic
                                  * security issues, so read the whole thing in.
                                  */
                                 size = profile_length - (sizeof profile_header)
                                     - 12 * tag_count;

                                 (void)png_inflate_read(png_ptr, local_buffer,
                                     (sizeof local_buffer), &length,
                                     profile + (sizeof profile_header) +
                                     12 * tag_count, &size, 1/*finish*/);

                                 if (length > 0 && !(png_ptr->flags &
                                     PNG_FLAG_BENIGN_ERRORS_WARN))
                                    errmsg = "extra compressed data";

                                 /* But otherwise allow extra data: */
                                 else if (size == 0)
                                 {
                                    if (length > 0)
                                    {
                                       /* This can be handled completely, so
                                        * keep going.
                                        */
                                       png_chunk_warning(png_ptr,
                                           "extra compressed data");
                                    }

                                    png_crc_finish(png_ptr, length);
                                    finished = 1;

# if defined(PNG_sRGB_SUPPORTED) && PNG_sRGB_PROFILE_CHECKS >= 0
                                    /* Check for a match against sRGB */
                                    png_icc_set_sRGB(png_ptr,
                                        &png_ptr->colorspace, profile,
                                        png_ptr->zstream.adler);
# endif

                                    /* Steal the profile for info_ptr. */
                                    if (info_ptr != NULL)
                                    {
                                       png_free_data(png_ptr, info_ptr,
                                           PNG_FREE_ICCP, 0);

                                       info_ptr->iccp_name = png_voidcast(char*,
                                           png_malloc_base(png_ptr,
                                           keyword_length+1));
                                       if (info_ptr->iccp_name != NULL)
                                       {
                                          memcpy(info_ptr->iccp_name, keyword,
                                              keyword_length+1);
                                          info_ptr->iccp_proflen =
                                              profile_length;
                                          info_ptr->iccp_profile = profile;
                                          png_ptr->read_buffer = NULL; /*steal*/
                                          info_ptr->free_me |= PNG_FREE_ICCP;
                                          info_ptr->valid |= PNG_INFO_iCCP;
                                       }

                                       else
                                       {
                                          png_ptr->colorspace.flags |=
                                             PNG_COLORSPACE_INVALID;
                                          errmsg = "out of memory";
                                       }
                                    }

                                    /* else the profile remains in the read
                                     * buffer which gets reused for subsequent
                                     * chunks.
                                     */

                                    if (info_ptr != NULL)
                                       png_colorspace_sync(png_ptr, info_ptr);

                                    if (errmsg == NULL)
                                    {
                                       png_ptr->zowner = 0;
                                       return;
                                    }
                                 }
                                 if (errmsg == NULL)
                                    errmsg = png_ptr->zstream.msg;
                              }
                              /* else png_icc_check_tag_table output an error */
                           }
                           else /* profile truncated */
                              errmsg = png_ptr->zstream.msg;
                        }

                        else
                           errmsg = "out of memory";
                     }

                     /* else png_icc_check_header output an error */
                  }

                  /* else png_icc_check_length output an error */
               }

               else /* profile truncated */
                  errmsg = png_ptr->zstream.msg;

               /* Release the stream */
               png_ptr->zowner = 0;
            }

            else /* png_inflate_claim failed */
               errmsg = png_ptr->zstream.msg;
         }

         else
            errmsg = "bad compression method"; /* or missing */
      }

      else
         errmsg = "bad keyword";
   }

   else
      errmsg = "too many profiles";

   /* Failure: the reason is in 'errmsg' */
   if (finished == 0)
      png_crc_finish(png_ptr, length);

   png_ptr->colorspace.flags |= PNG_COLORSPACE_INVALID;
   png_colorspace_sync(png_ptr, info_ptr);
   if (errmsg != NULL) /* else already output */
      png_chunk_benign_error(png_ptr, errmsg);
}